

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogBufferDescriptor.h
# Opt level: O2

void aeron::concurrent::logbuffer::LogBufferDescriptor::checkPageSize(int32_t pageSize)

{
  IllegalStateException *pIVar1;
  char *pcVar2;
  allocator local_fa;
  allocator local_f9;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if (pageSize < 0x1000) {
    pIVar1 = (IllegalStateException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_f8,0x1000);
    std::operator+(&local_d8,"page size less than min size of ",&local_f8);
    std::operator+(&local_b8,&local_d8,", size=");
    std::__cxx11::to_string(&local_58,pageSize);
    std::operator+(&local_98,&local_b8,&local_58);
    std::__cxx11::string::string
              ((string *)&local_78,
               "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkPageSize(std::int32_t)"
               ,&local_f9);
    pcVar2 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/LogBufferDescriptor.h"
                              );
    std::__cxx11::string::string((string *)&local_38,pcVar2,&local_fa);
    util::IllegalStateException::IllegalStateException(pIVar1,&local_98,&local_78,&local_38,0xb3);
    __cxa_throw(pIVar1,&util::IllegalStateException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  if ((uint)pageSize < 0x40000001) {
    if ((pageSize + 0x7fffffffU & pageSize) == 0) {
      return;
    }
    pIVar1 = (IllegalStateException *)__cxa_allocate_exception(0x48);
    std::__cxx11::to_string(&local_b8,pageSize);
    std::operator+(&local_98,"page size not a power of 2, size=",&local_b8);
    std::__cxx11::string::string
              ((string *)&local_d8,
               "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkPageSize(std::int32_t)"
               ,(allocator *)&local_58);
    pcVar2 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                               ,
                               "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/LogBufferDescriptor.h"
                              );
    std::__cxx11::string::string((string *)&local_f8,pcVar2,(allocator *)&local_78);
    util::IllegalStateException::IllegalStateException(pIVar1,&local_98,&local_d8,&local_f8,0xc0);
    __cxa_throw(pIVar1,&util::IllegalStateException::typeinfo,
                util::SourcedException::~SourcedException);
  }
  pIVar1 = (IllegalStateException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_f8,0x40000000);
  std::operator+(&local_d8,"page size greater than max size of ",&local_f8);
  std::operator+(&local_b8,&local_d8,", size=");
  std::__cxx11::to_string(&local_58,pageSize);
  std::operator+(&local_98,&local_b8,&local_58);
  std::__cxx11::string::string
            ((string *)&local_78,
             "void aeron::concurrent::logbuffer::LogBufferDescriptor::checkPageSize(std::int32_t)",
             &local_f9);
  pcVar2 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/logbuffer/LogBufferDescriptor.h"
                            );
  std::__cxx11::string::string((string *)&local_38,pcVar2,&local_fa);
  util::IllegalStateException::IllegalStateException(pIVar1,&local_98,&local_78,&local_38,0xba);
  __cxa_throw(pIVar1,&util::IllegalStateException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

inline void checkPageSize(std::int32_t pageSize)
{
    if (pageSize < AERON_PAGE_MIN_SIZE)
    {
        throw util::IllegalStateException(
            "page size less than min size of " + std::to_string(AERON_PAGE_MIN_SIZE) +
            ", size=" + std::to_string(pageSize), SOURCEINFO);
    }

    if (pageSize > AERON_PAGE_MAX_SIZE)
    {
        throw util::IllegalStateException(
            "page size greater than max size of " + std::to_string(AERON_PAGE_MAX_SIZE) +
            ", size=" + std::to_string(pageSize), SOURCEINFO);
    }

    if (!util::BitUtil::isPowerOfTwo(pageSize))
    {
        throw util::IllegalStateException(
            "page size not a power of 2, size=" + std::to_string(pageSize), SOURCEINFO);
    }
}